

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Object.hpp
# Opt level: O2

vector<Item,_std::allocator<Item>_> *
getContent(vector<Item,_std::allocator<Item>_> *__return_storage_ptr__,Item *item)

{
  string *__lhs;
  bool bVar1;
  vector<Item,_std::allocator<Item>_> *__x;
  _Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_> *p_Var2;
  list<Item,_std::allocator<Item>_> l;
  Item i;
  _Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_> local_c0;
  Item local_90;
  
  __lhs = &item->type;
  bVar1 = std::operator==(__lhs,"Array");
  if ((bVar1) || (bVar1 = std::operator==(__lhs,"MutableArray"), bVar1)) {
    __x = (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x38);
  }
  else {
    bVar1 = std::operator==(__lhs,"ArrayList");
    if ((!bVar1) && (bVar1 = std::operator==(__lhs,"MutableArrayList"), !bVar1)) {
      bVar1 = std::operator==(__lhs,"List");
      if (bVar1) {
        std::__cxx11::list<Item,_std::allocator<Item>_>::list
                  ((list<Item,_std::allocator<Item>_> *)&local_c0,
                   (list<Item,_std::allocator<Item>_> *)((long)item->value + 0x38));
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var2 = &local_c0;
        while (p_Var2 = *(_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
                          **)&p_Var2->_M_impl, p_Var2 != &local_c0) {
          Item::Item(&local_90,(Item *)&(p_Var2->_M_impl).super__Rb_tree_header._M_header._M_parent)
          ;
          std::vector<Item,_std::allocator<Item>_>::push_back(__return_storage_ptr__,&local_90);
          Item::~Item(&local_90);
        }
      }
      else {
        bVar1 = std::operator==(__lhs,"MutableList");
        if (!bVar1) {
          bVar1 = std::operator==(__lhs,"Set");
          if (bVar1) {
            std::_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
            ::_Rb_tree(&local_c0,
                       (_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
                        *)((long)item->value + 0x38));
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (; (_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
                   &local_c0._M_impl.super__Rb_tree_header;
                local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)
                     std::_Rb_tree_increment
                               (local_c0._M_impl.super__Rb_tree_header._M_header._M_left)) {
              Item::Item(&local_90,
                         (Item *)(local_c0._M_impl.super__Rb_tree_header._M_header._M_left + 1));
              std::vector<Item,_std::allocator<Item>_>::push_back(__return_storage_ptr__,&local_90);
              Item::~Item(&local_90);
            }
          }
          else {
            std::operator==(__lhs,"MutableSet");
            std::_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
            ::_Rb_tree(&local_c0,
                       (_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
                        *)((long)item->value + 0x70));
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_start = (pointer)0x0;
            (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
            super__Vector_impl_data._M_finish = (pointer)0x0;
            for (; (_Rb_tree_header *)local_c0._M_impl.super__Rb_tree_header._M_header._M_left !=
                   &local_c0._M_impl.super__Rb_tree_header;
                local_c0._M_impl.super__Rb_tree_header._M_header._M_left =
                     (_Base_ptr)
                     std::_Rb_tree_increment
                               (local_c0._M_impl.super__Rb_tree_header._M_header._M_left)) {
              Item::Item(&local_90,
                         (Item *)(local_c0._M_impl.super__Rb_tree_header._M_header._M_left + 1));
              std::vector<Item,_std::allocator<Item>_>::push_back(__return_storage_ptr__,&local_90);
              Item::~Item(&local_90);
            }
          }
          std::_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>::
          ~_Rb_tree(&local_c0);
          return __return_storage_ptr__;
        }
        std::__cxx11::list<Item,_std::allocator<Item>_>::list
                  ((list<Item,_std::allocator<Item>_> *)&local_c0,
                   (list<Item,_std::allocator<Item>_> *)((long)item->value + 0x58));
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        (__return_storage_ptr__->super__Vector_base<Item,_std::allocator<Item>_>)._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        p_Var2 = &local_c0;
        while (p_Var2 = *(_Rb_tree<Item,_Item,_std::_Identity<Item>,_std::less<Item>,_std::allocator<Item>_>
                          **)&p_Var2->_M_impl, p_Var2 != &local_c0) {
          Item::Item(&local_90,(Item *)&(p_Var2->_M_impl).super__Rb_tree_header._M_header._M_parent)
          ;
          std::vector<Item,_std::allocator<Item>_>::push_back(__return_storage_ptr__,&local_90);
          Item::~Item(&local_90);
        }
      }
      std::__cxx11::_List_base<Item,_std::allocator<Item>_>::_M_clear
                ((_List_base<Item,_std::allocator<Item>_> *)&local_c0);
      return __return_storage_ptr__;
    }
    __x = (vector<Item,_std::allocator<Item>_> *)((long)item->value + 0x58);
  }
  std::vector<Item,_std::allocator<Item>_>::vector(__return_storage_ptr__,__x);
  return __return_storage_ptr__;
}

Assistant:

vector<Item> getContent(Item item) {
	if (item.type == "Array") {
		return static_cast<Array *>(item.value)->content;
	}
	if (item.type == "MutableArray") {
		return static_cast<MutableArray *>(item.value)->content;
	}
	if (item.type == "ArrayList") {
		return static_cast<ArrayList *>(item.value)->content;
	}
	if (item.type == "MutableArrayList") {
		return static_cast<MutableArrayList *>(item.value)->content;
	}
	if (item.type == "List") {
		list<Item> l = static_cast<List *>(item.value)->content;
		vector<Item> ret;
		for (Item i : l) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "MutableList") {
		list<Item> l = static_cast<MutableList *>(item.value)->content;
		vector<Item> ret;
		for (Item i : l) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "Set") {
		set<Item> s = static_cast<Set *>(item.value)->content;
		vector<Item> ret;
		for (Item i : s) {
			ret.push_back(i);
		}
		return ret;
	}
	if (item.type == "MutableSet") {
		set<Item> s = static_cast<MutableSet *>(item.value)->content;
		vector<Item> ret;
		for (Item i : s) {
			ret.push_back(i);
		}
		return ret;
	}
}